

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_chain_clone(llama_sampler *smpl)

{
  bool bVar1;
  reference pplVar2;
  long in_RDI;
  llama_sampler *smpl_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *__range1;
  llama_sampler *result;
  llama_sampler_chain *chain_src;
  llama_sampler *in_stack_ffffffffffffffb8;
  llama_sampler *in_stack_ffffffffffffffc0;
  __normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
  local_30;
  undefined1 *local_28;
  undefined1 local_19;
  llama_sampler *local_18;
  undefined1 *local_10;
  
  local_10 = *(undefined1 **)(in_RDI + 8);
  local_19 = *local_10;
  local_18 = llama_sampler_chain_init
                       ((llama_sampler_chain_params)
                        SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  local_28 = local_10 + 8;
  local_30._M_current =
       (llama_sampler **)
       std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::begin
                 ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)
                  in_stack_ffffffffffffffb8);
  std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::end
            ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)in_stack_ffffffffffffffb8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    pplVar2 = __gnu_cxx::
              __normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = *pplVar2;
    in_stack_ffffffffffffffb8 = local_18;
    llama_sampler_clone(local_18);
    llama_sampler_chain_add(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
    ::operator++(&local_30);
  }
  return local_18;
}

Assistant:

static struct llama_sampler * llama_sampler_chain_clone(const struct llama_sampler * smpl) {
    const auto * chain_src = (const llama_sampler_chain *) smpl->ctx;

    auto * result = llama_sampler_chain_init(chain_src->params);

    for (auto * smpl : chain_src->samplers) {
        llama_sampler_chain_add(result, llama_sampler_clone(smpl));
    }

    return result;
}